

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

void __thiscall gjkepa2_impl::EPA::Initialize(EPA *this)

{
  undefined4 *in_RDI;
  U i;
  uint local_28;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c;
  btVector3 local_18;
  
  *in_RDI = 9;
  local_1c = 0.0;
  local_20 = 0.0;
  local_24 = 0.0;
  btVector3::btVector3(&local_18,&local_1c,&local_20,&local_24);
  *(undefined8 *)(in_RDI + 0x10) = local_18.m_floats._0_8_;
  *(undefined8 *)(in_RDI + 0x12) = local_18.m_floats._8_8_;
  in_RDI[0x14] = 0;
  in_RDI[0xe16] = 0;
  for (local_28 = 0; local_28 < 0x80; local_28 = local_28 + 1) {
    append((sList *)(in_RDI + 0xe1c),(sFace *)(in_RDI + (ulong)(0x7f - local_28) * 0x18 + 0x216));
  }
  return;
}

Assistant:

void				Initialize()
			{
				m_status	=	eStatus::Failed;
				m_normal	=	btVector3(0,0,0);
				m_depth		=	0;
				m_nextsv	=	0;
				for(U i=0;i<EPA_MAX_FACES;++i)
				{
					append(m_stock,&m_fc_store[EPA_MAX_FACES-i-1]);
				}
			}